

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O0

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::performSolutionPolishing
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  Status *pSVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Status SVar6;
  Verbosity VVar7;
  Representation RVar8;
  Type TVar9;
  int iVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  int *piVar12;
  char *pcVar13;
  DataKey *pDVar14;
  SPxId *pSVar15;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar16;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Verbosity old_verbosity_1;
  int i_9;
  int i_8;
  DIdxSet basiccandidates_1;
  int i_7;
  int i_6;
  DIdxSet basiccandidates;
  int ncols_1;
  bool useIntegrality;
  int i_5;
  int i_4;
  DIdxSet candidates;
  int i_3;
  int i_2;
  int i_1;
  int i;
  DIdxSet continuousvars;
  DIdxSet slackcandidates;
  int ncols;
  int nrows;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  origval;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  alloweddeviation;
  bool success;
  SPxId polishId;
  Status stat;
  Status *colstatus;
  Status *rowstatus;
  Desc *ds;
  int nSuccessfulPivots;
  bool stop;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  SPxId *in_stack_00000f10;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000f18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined1 in_stack_000011e3;
  int in_stack_000011e4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000011e8;
  undefined4 in_stack_fffffffffffff0b8;
  int in_stack_fffffffffffff0bc;
  undefined6 in_stack_fffffffffffff0c0;
  undefined1 in_stack_fffffffffffff0c6;
  undefined1 in_stack_fffffffffffff0c7;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff0c8;
  SPxStatus stat_00;
  undefined4 in_stack_fffffffffffff0d0;
  undefined2 in_stack_fffffffffffff0d4;
  byte in_stack_fffffffffffff0d6;
  undefined1 in_stack_fffffffffffff0d7;
  undefined4 in_stack_fffffffffffff0d8;
  int in_stack_fffffffffffff0dc;
  DIdxSet *in_stack_fffffffffffff0e0;
  DataArray<int> *this_00;
  byte local_efe;
  byte local_e9a;
  undefined1 in_stack_fffffffffffff167;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff168;
  byte local_e85;
  byte local_e63;
  byte local_e4b;
  byte local_e1d;
  undefined1 local_e1c [128];
  undefined1 local_d9c [92];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff2c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff2c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff2d0;
  undefined1 local_d1c [128];
  undefined4 local_c9c;
  Verbosity local_c98;
  uint local_c94;
  undefined4 local_c10;
  undefined1 local_c0c [128];
  undefined1 local_b8c [128];
  SPxColId local_b0c;
  int local_b04;
  IdxSet local_b00;
  uint local_adc;
  undefined4 local_a58;
  undefined1 local_a54 [128];
  undefined1 local_9d4 [128];
  SPxColId local_954;
  int local_94c;
  IdxSet local_948;
  int local_924;
  byte local_91d;
  undefined1 local_91c [128];
  DataKey local_89c;
  uint local_894;
  undefined4 local_810;
  undefined1 local_80c [128];
  undefined1 local_78c [128];
  int local_70c;
  IdxSet local_708;
  DataKey local_6e4;
  uint local_6dc;
  DataKey local_6d8;
  uint local_6d0;
  undefined4 local_64c;
  undefined1 local_648 [128];
  undefined1 local_5c8 [128];
  int local_548;
  undefined4 local_4c4;
  undefined1 local_4c0 [128];
  undefined1 local_440 [128];
  int local_3c0;
  IdxSet local_3b0;
  IdxSet local_390;
  int local_36c;
  int local_368;
  undefined1 local_364 [128];
  undefined4 local_2e4;
  Verbosity local_2e0;
  undefined1 local_2dc [128];
  undefined1 local_25c [131];
  byte local_1d9;
  DataKey local_1d8;
  Status local_1cc;
  Status *local_1c8;
  Status *local_1c0;
  Desc *local_1b8;
  int local_1b0;
  byte local_1a9;
  bool local_199;
  undefined8 local_198;
  undefined4 *local_190;
  undefined1 *local_188;
  undefined8 local_180;
  undefined4 *local_178;
  undefined1 *local_170;
  undefined8 local_168;
  undefined4 *local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined4 *local_148;
  undefined1 *local_140;
  undefined8 local_138;
  undefined4 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined1 *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined4 *local_a8;
  undefined4 *local_a0;
  undefined4 *local_98;
  undefined4 *local_90;
  undefined4 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_e1d = 0;
  if (-1 < in_RDI->maxIters) {
    iVar5 = iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x6b0a7e);
    local_e1d = 0;
    if (in_RDI->maxIters <= iVar5) {
      bVar3 = isTimeLimitReached(in_stack_fffffffffffff168,(bool)in_stack_fffffffffffff167);
      local_e1d = bVar3 ^ 0xff;
    }
  }
  local_1a9 = local_e1d & 1;
  if (((local_1a9 == 0) && (in_RDI->polishObj != POLISH_OFF)) &&
     (SVar6 = status(in_stack_fffffffffffff0c8), SVar6 == OPTIMAL)) {
    local_1b8 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::desc(&in_RDI->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      );
    local_1c0 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::Desc::rowStatus((Desc *)0x6b0b24);
    local_1c8 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::Desc::colStatus((Desc *)0x6b0b39);
    SPxId::SPxId((SPxId *)0x6b0b4e);
    local_1d9 = 0;
    local_120 = local_25c;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff0c7,
                        CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)));
    (*(in_RDI->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x5e])(local_2dc);
    if ((in_RDI->spxout != (SPxOut *)0x0) &&
       (VVar7 = SPxOut::getVerbosity(in_RDI->spxout), 3 < (int)VVar7)) {
      local_2e0 = SPxOut::getVerbosity(in_RDI->spxout);
      local_2e4 = 4;
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_2e4);
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffff0c7,
                                  CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)),
                         (char *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffff0c7,
                                  CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)),
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_2e0);
    }
    RVar8 = rep(in_RDI);
    TVar9 = (Type)((ulong)in_stack_fffffffffffff0c8 >> 0x20);
    if (RVar8 == COLUMN) {
      setType((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT17(in_stack_fffffffffffff0d7,
                          CONCAT16(in_stack_fffffffffffff0d6,
                                   CONCAT24(in_stack_fffffffffffff0d4,in_stack_fffffffffffff0d0))),
              TVar9);
      (*(in_RDI->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])();
      entertol((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
      local_b0 = local_25c;
      local_b8 = local_364;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff0c7,
                          CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)),
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      in_RDI->instableEnter = false;
      pSVar1 = in_RDI->theratiotester;
      TVar9 = type(in_RDI);
      (*pSVar1->_vptr_SPxRatioTester[9])(pSVar1,(ulong)(uint)TVar9);
      local_368 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x6b0d16);
      local_36c = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x6b0d2a);
      if (in_RDI->polishObj == POLISH_INTEGRALITY) {
        DIdxSet::DIdxSet(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0dc);
        DIdxSet::DIdxSet(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0dc);
        for (local_3c0 = 0; local_3c0 < local_368; local_3c0 = local_3c0 + 1) {
          if ((local_1c0[local_3c0] == P_ON_LOWER) || (local_1c0[local_3c0] == P_ON_UPPER)) {
            local_118 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT17(in_stack_fffffffffffff0c7,
                                                 CONCAT16(in_stack_fffffffffffff0c6,
                                                          in_stack_fffffffffffff0c0)),
                                     in_stack_fffffffffffff0bc);
            local_110 = local_440;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff0c7,
                                CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)),
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
            local_4c4 = 0;
            local_188 = local_4c0;
            local_190 = &local_4c4;
            local_198 = 0;
            local_88 = local_190;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff0d7,
                                CONCAT16(in_stack_fffffffffffff0d6,
                                         CONCAT24(in_stack_fffffffffffff0d4,
                                                  in_stack_fffffffffffff0d0))),
                       (longlong)in_stack_fffffffffffff0c8,
                       (type *)CONCAT17(in_stack_fffffffffffff0c7,
                                        CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0
                                                )));
            epsilon(in_stack_fffffffffffff0c8);
            bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                               in_stack_fffffffffffff2c0);
            if (bVar3) {
              DIdxSet::addIdx((DIdxSet *)
                              CONCAT17(in_stack_fffffffffffff0c7,
                                       CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)
                                      ),in_stack_fffffffffffff0bc);
            }
          }
        }
        iVar5 = DataArray<int>::size(&in_RDI->integerVariables);
        if (iVar5 == local_36c) {
          for (local_548 = 0; local_548 < local_36c; local_548 = local_548 + 1) {
            if ((local_1c8[local_548] == P_ON_LOWER) || (local_1c8[local_548] == P_ON_UPPER)) {
              pnVar11 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT17(in_stack_fffffffffffff0c7,
                                             CONCAT16(in_stack_fffffffffffff0c6,
                                                      in_stack_fffffffffffff0c0)),
                                 in_stack_fffffffffffff0bc);
              local_38 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)CONCAT17(in_stack_fffffffffffff0c7,
                                                  CONCAT16(in_stack_fffffffffffff0c6,
                                                           in_stack_fffffffffffff0c0)),
                                      in_stack_fffffffffffff0bc);
              local_30 = pnVar11;
              local_28 = local_5c8;
              boost::multiprecision::detail::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
              ::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_39,pnVar11,local_38);
              local_20 = local_5c8;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<200U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff0c7,
                                  CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)));
              local_10 = local_30;
              local_18 = local_38;
              local_8 = local_5c8;
              boost::multiprecision::default_ops::
              eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        ((cpp_dec_float<200U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff0c7,
                                  CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)),
                         (cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
                         (cpp_dec_float<200U,_int,_void> *)0x6b108c);
              local_64c = 0;
              local_170 = local_648;
              local_178 = &local_64c;
              local_180 = 0;
              local_90 = local_178;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>
                        ((cpp_dec_float<200U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff0d7,
                                  CONCAT16(in_stack_fffffffffffff0d6,
                                           CONCAT24(in_stack_fffffffffffff0d4,
                                                    in_stack_fffffffffffff0d0))),
                         (longlong)in_stack_fffffffffffff0c8,
                         (type *)CONCAT17(in_stack_fffffffffffff0c7,
                                          CONCAT16(in_stack_fffffffffffff0c6,
                                                   in_stack_fffffffffffff0c0)));
              epsilon(in_stack_fffffffffffff0c8);
              bVar4 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                                 in_stack_fffffffffffff2c0);
              bVar3 = false;
              if (bVar4) {
                piVar12 = DataArray<int>::operator[](&in_RDI->integerVariables,local_548);
                bVar3 = *piVar12 == 0;
              }
              if (bVar3) {
                DIdxSet::addIdx((DIdxSet *)
                                CONCAT17(in_stack_fffffffffffff0c7,
                                         CONCAT16(in_stack_fffffffffffff0c6,
                                                  in_stack_fffffffffffff0c0)),
                                in_stack_fffffffffffff0bc);
              }
            }
          }
        }
        while (stat_00 = (SPxStatus)((ulong)in_stack_fffffffffffff0c8 >> 0x20),
              ((local_1a9 ^ 0xff) & 1) != 0) {
          local_1b0 = 0;
          local_6d0 = IdxSet::size(&local_390);
          uVar16 = extraout_RDX;
          while( true ) {
            local_6d0 = local_6d0 - 1;
            local_e4b = 0;
            if (-1 < (int)local_6d0) {
              local_e4b = local_1a9 ^ 0xff;
            }
            if ((local_e4b & 1) == 0) break;
            IdxSet::index(&local_390,(char *)(ulong)local_6d0,(int)uVar16);
            local_6d8 = (DataKey)coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)CONCAT44(in_stack_fffffffffffff0dc,
                                                  in_stack_fffffffffffff0d8),
                                      CONCAT13(in_stack_fffffffffffff0d7,
                                               CONCAT12(in_stack_fffffffffffff0d6,
                                                        in_stack_fffffffffffff0d4)));
            pSVar2 = local_1c0;
            local_1d8 = local_6d8;
            pcVar13 = IdxSet::index(&local_390,(char *)(ulong)local_6d0,__c);
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[27],_soplex::SPxId_&,_const_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status_&,_0>
                      (in_RDI,(char (*) [27])"try pivoting: {} stat: {}\n",(SPxId *)&local_1d8,
                       pSVar2 + (int)pcVar13);
            local_1d9 = enter(in_stack_00000f18,in_stack_00000f10,(bool)precision_guard);
            (*(in_RDI->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])();
            if ((local_1d9 & 1) != 0) {
              SPxOut::
              debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[13],_0>
                        (in_RDI,(char (*) [13])" -> success!");
              local_1b0 = local_1b0 + 1;
              IdxSet::remove(&local_390,(char *)(ulong)local_6d0);
              if ((-1 < in_RDI->maxIters) &&
                 (iVar5 = iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)0x6b1369), in_RDI->maxIters <= iVar5)) {
                local_1a9 = 1;
              }
            }
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[2],_0>
                      (in_RDI,(char (*) [2])0x7e7535);
            bVar3 = isTimeLimitReached(in_stack_fffffffffffff168,(bool)in_stack_fffffffffffff167);
            uVar16 = extraout_RDX_00;
            if (bVar3) {
              local_1a9 = 1;
            }
          }
          local_6dc = IdxSet::size(&local_3b0);
          uVar16 = extraout_RDX_01;
          while( true ) {
            local_6dc = local_6dc - 1;
            local_e63 = 0;
            if (-1 < (int)local_6dc) {
              local_e63 = local_1a9 ^ 0xff;
            }
            if ((local_e63 & 1) == 0) break;
            IdxSet::index(&local_3b0,(char *)(ulong)local_6dc,(int)uVar16);
            local_6e4 = (DataKey)id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8)
                                    ,CONCAT13(in_stack_fffffffffffff0d7,
                                              CONCAT12(in_stack_fffffffffffff0d6,
                                                       in_stack_fffffffffffff0d4)));
            pSVar2 = local_1c8;
            local_1d8 = local_6e4;
            pcVar13 = IdxSet::index(&local_3b0,(char *)(ulong)local_6dc,__c_00);
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[27],_soplex::SPxId_&,_const_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status_&,_0>
                      (in_RDI,(char (*) [27])"try pivoting: {} stat: {}\n",(SPxId *)&local_1d8,
                       pSVar2 + (int)pcVar13);
            local_1d9 = enter(in_stack_00000f18,in_stack_00000f10,(bool)precision_guard);
            (*(in_RDI->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])();
            if ((local_1d9 & 1) != 0) {
              SPxOut::
              debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[13],_0>
                        (in_RDI,(char (*) [13])" -> success!");
              local_1b0 = local_1b0 + 1;
              IdxSet::remove(&local_3b0,(char *)(ulong)local_6dc);
              if ((-1 < in_RDI->maxIters) &&
                 (iVar5 = iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)0x6b1574), in_RDI->maxIters <= iVar5)) {
                local_1a9 = 1;
              }
            }
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[2],_0>
                      (in_RDI,(char (*) [2])0x7e7535);
            bVar3 = isTimeLimitReached(in_stack_fffffffffffff168,(bool)in_stack_fffffffffffff167);
            uVar16 = extraout_RDX_02;
            if (bVar3) {
              local_1a9 = 1;
            }
          }
          if (local_1b0 == 0) {
            local_1a9 = 1;
          }
          in_RDI->polishCount = local_1b0 + in_RDI->polishCount;
        }
        DIdxSet::~DIdxSet((DIdxSet *)
                          CONCAT17(in_stack_fffffffffffff0c7,
                                   CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)));
        DIdxSet::~DIdxSet((DIdxSet *)
                          CONCAT17(in_stack_fffffffffffff0c7,
                                   CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)));
      }
      else {
        dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x6b1659);
        DIdxSet::DIdxSet(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0dc);
        local_70c = 0;
        while( true ) {
          iVar5 = local_70c;
          iVar10 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)0x6b168e);
          local_e85 = 0;
          if (iVar5 < iVar10) {
            local_e85 = local_1a9 ^ 0xff;
          }
          if ((local_e85 & 1) == 0) break;
          if ((local_1c8[local_70c] == P_ON_LOWER) || (local_1c8[local_70c] == P_ON_UPPER)) {
            in_stack_fffffffffffff168 =
                 (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT17(in_stack_fffffffffffff0c7,
                                         CONCAT16(in_stack_fffffffffffff0c6,
                                                  in_stack_fffffffffffff0c0)),
                             in_stack_fffffffffffff0bc);
            local_78 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT17(in_stack_fffffffffffff0c7,
                                                CONCAT16(in_stack_fffffffffffff0c6,
                                                         in_stack_fffffffffffff0c0)),
                                    in_stack_fffffffffffff0bc);
            local_70 = in_stack_fffffffffffff168;
            local_68 = local_78c;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_79,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff168,local_78);
            local_60 = local_78c;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff0c7,
                                CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)));
            local_50 = local_70;
            local_58 = local_78;
            local_48 = local_78c;
            boost::multiprecision::default_ops::
            eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff0c7,
                                CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)),
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
                       (cpp_dec_float<200U,_int,_void> *)0x6b17f3);
            local_810 = 0;
            local_158 = local_80c;
            local_160 = &local_810;
            local_168 = 0;
            local_98 = local_160;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff0d7,
                                CONCAT16(in_stack_fffffffffffff0d6,
                                         CONCAT24(in_stack_fffffffffffff0d4,
                                                  in_stack_fffffffffffff0d0))),
                       (longlong)in_stack_fffffffffffff0c8,
                       (type *)CONCAT17(in_stack_fffffffffffff0c7,
                                        CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0
                                                )));
            epsilon(in_stack_fffffffffffff0c8);
            in_stack_fffffffffffff167 =
                 EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                            in_stack_fffffffffffff2c0);
            if ((bool)in_stack_fffffffffffff167) {
              DIdxSet::addIdx((DIdxSet *)
                              CONCAT17(in_stack_fffffffffffff0c7,
                                       CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)
                                      ),in_stack_fffffffffffff0bc);
            }
          }
          local_70c = local_70c + 1;
        }
        while (stat_00 = (SPxStatus)((ulong)in_stack_fffffffffffff0c8 >> 0x20),
              ((local_1a9 ^ 0xff) & 1) != 0) {
          local_1b0 = 0;
          local_894 = IdxSet::size(&local_708);
          uVar16 = extraout_RDX_03;
          while( true ) {
            local_894 = local_894 - 1;
            local_e9a = 0;
            if (-1 < (int)local_894) {
              local_e9a = local_1a9 ^ 0xff;
            }
            if ((local_e9a & 1) == 0) break;
            IdxSet::index(&local_708,(char *)(ulong)local_894,(int)uVar16);
            local_89c = (DataKey)id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8)
                                    ,CONCAT13(in_stack_fffffffffffff0d7,
                                              CONCAT12(in_stack_fffffffffffff0d6,
                                                       in_stack_fffffffffffff0d4)));
            pSVar2 = local_1c8;
            local_1d8 = local_89c;
            pcVar13 = IdxSet::index(&local_708,(char *)(ulong)local_894,__c_01);
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[27],_soplex::SPxId_&,_const_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status_&,_0>
                      (in_RDI,(char (*) [27])"try pivoting: {} stat: {}\n",(SPxId *)&local_1d8,
                       pSVar2 + (int)pcVar13);
            local_1d9 = enter(in_stack_00000f18,in_stack_00000f10,(bool)precision_guard);
            (*(in_RDI->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])();
            if ((local_1d9 & 1) != 0) {
              SPxOut::
              debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[13],_0>
                        (in_RDI,(char (*) [13])" -> success!");
              local_1b0 = local_1b0 + 1;
              IdxSet::remove(&local_708,(char *)(ulong)local_894);
              if ((-1 < in_RDI->maxIters) &&
                 (iVar5 = iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)0x6b1ab5), in_RDI->maxIters <= iVar5)) {
                local_1a9 = 1;
              }
            }
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[2],_0>
                      (in_RDI,(char (*) [2])0x7e7535);
            bVar3 = isTimeLimitReached(in_stack_fffffffffffff168,(bool)in_stack_fffffffffffff167);
            uVar16 = extraout_RDX_04;
            if (bVar3) {
              local_1a9 = 1;
            }
          }
          if (local_1b0 == 0) {
            local_1a9 = 1;
          }
          in_RDI->polishCount = local_1b0 + in_RDI->polishCount;
        }
        DIdxSet::~DIdxSet((DIdxSet *)
                          CONCAT17(in_stack_fffffffffffff0c7,
                                   CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)));
      }
    }
    else {
      setType((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT17(in_stack_fffffffffffff0d7,
                          CONCAT16(in_stack_fffffffffffff0d6,
                                   CONCAT24(in_stack_fffffffffffff0d4,in_stack_fffffffffffff0d0))),
              TVar9);
      (*(in_RDI->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])();
      leavetol((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
      local_c0 = local_25c;
      local_c8 = local_91c;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff0c7,
                          CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)),
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      in_RDI->instableLeave = false;
      pSVar1 = in_RDI->theratiotester;
      TVar9 = type(in_RDI);
      (*pSVar1->_vptr_SPxRatioTester[9])(pSVar1,(ulong)(uint)TVar9);
      local_91d = 0;
      local_924 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x6b1c23);
      iVar5 = DataArray<int>::size(&in_RDI->integerVariables);
      if (iVar5 == local_924) {
        local_91d = 1;
      }
      if (in_RDI->polishObj == POLISH_INTEGRALITY) {
        dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x6b1c71);
        DIdxSet::DIdxSet(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0dc);
        for (local_94c = 0; iVar5 = local_94c,
            iVar10 = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0x6b1ca6), iVar5 < iVar10; local_94c = local_94c + 1) {
          pDVar14 = &SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT17(in_stack_fffffffffffff0c7,
                                          CONCAT16(in_stack_fffffffffffff0c6,
                                                   in_stack_fffffffffffff0c0)),
                              in_stack_fffffffffffff0bc)->super_DataKey;
          local_1d8 = *pDVar14;
          bVar3 = SPxId::isSPxRowId((SPxId *)&local_1d8);
          if (bVar3) {
            SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT17(in_stack_fffffffffffff0d7,
                                 CONCAT16(in_stack_fffffffffffff0d6,
                                          CONCAT24(in_stack_fffffffffffff0d4,
                                                   in_stack_fffffffffffff0d0))),
                     (SPxId *)in_stack_fffffffffffff0c8);
            local_1cc = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::Desc::rowStatus((Desc *)CONCAT17(in_stack_fffffffffffff0c7,
                                                           CONCAT16(in_stack_fffffffffffff0c6,
                                                                    in_stack_fffffffffffff0c0)),
                                          in_stack_fffffffffffff0bc);
LAB_006b1e29:
            if ((local_1cc == P_ON_LOWER) || (local_1cc == P_ON_UPPER)) {
              local_108 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT17(in_stack_fffffffffffff0c7,
                                                   CONCAT16(in_stack_fffffffffffff0c6,
                                                            in_stack_fffffffffffff0c0)),
                                       in_stack_fffffffffffff0bc);
              local_100 = local_9d4;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<200U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff0c7,
                                  CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)),
                         (cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
              local_a58 = 0;
              local_140 = local_a54;
              local_148 = &local_a58;
              local_150 = 0;
              local_a0 = local_148;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>
                        ((cpp_dec_float<200U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff0d7,
                                  CONCAT16(in_stack_fffffffffffff0d6,
                                           CONCAT24(in_stack_fffffffffffff0d4,
                                                    in_stack_fffffffffffff0d0))),
                         (longlong)in_stack_fffffffffffff0c8,
                         (type *)CONCAT17(in_stack_fffffffffffff0c7,
                                          CONCAT16(in_stack_fffffffffffff0c6,
                                                   in_stack_fffffffffffff0c0)));
              epsilon(in_stack_fffffffffffff0c8);
              bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                                 in_stack_fffffffffffff2c0);
              if (bVar3) {
                DIdxSet::addIdx((DIdxSet *)
                                CONCAT17(in_stack_fffffffffffff0c7,
                                         CONCAT16(in_stack_fffffffffffff0c6,
                                                  in_stack_fffffffffffff0c0)),
                                in_stack_fffffffffffff0bc);
              }
            }
          }
          else {
            bVar3 = true;
            if ((local_91d & 1) != 0) {
              SPxColId::SPxColId(&local_954,(SPxId *)&local_1d8);
              iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT17(in_stack_fffffffffffff0c7,
                                           CONCAT16(in_stack_fffffffffffff0c6,
                                                    in_stack_fffffffffffff0c0)),
                               (SPxColId *)
                               CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
              piVar12 = DataArray<int>::operator[](&in_RDI->integerVariables,iVar5);
              bVar3 = *piVar12 == 1;
            }
            if (!bVar3) {
              SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffff0d7,
                                   CONCAT16(in_stack_fffffffffffff0d6,
                                            CONCAT24(in_stack_fffffffffffff0d4,
                                                     in_stack_fffffffffffff0d0))),
                       (SPxId *)in_stack_fffffffffffff0c8);
              local_1cc = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::Desc::colStatus((Desc *)CONCAT17(in_stack_fffffffffffff0c7,
                                                             CONCAT16(in_stack_fffffffffffff0c6,
                                                                      in_stack_fffffffffffff0c0)),
                                            in_stack_fffffffffffff0bc);
              goto LAB_006b1e29;
            }
          }
        }
        while (stat_00 = (SPxStatus)((ulong)in_stack_fffffffffffff0c8 >> 0x20),
              ((local_1a9 ^ 0xff) & 1) != 0) {
          local_1b0 = 0;
          local_adc = IdxSet::size(&local_948);
          uVar16 = extraout_RDX_05;
          while( true ) {
            local_adc = local_adc - 1;
            local_efe = 0;
            if (-1 < (int)local_adc) {
              local_efe = local_1a9 ^ 0xff;
            }
            if ((local_efe & 1) == 0) break;
            IdxSet::index(&local_948,(char *)(ulong)local_adc,(int)uVar16);
            pSVar15 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT17(in_stack_fffffffffffff0c7,
                                           CONCAT16(in_stack_fffffffffffff0c6,
                                                    in_stack_fffffffffffff0c0)),
                               in_stack_fffffffffffff0bc);
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[17],_soplex::SPxId_&,_0>
                      (in_RDI,(char (*) [17])"try pivoting: {}",pSVar15);
            IdxSet::index(&local_948,(char *)(ulong)local_adc,__c_02);
            local_1d9 = leave(in_stack_000011e8,in_stack_000011e4,(bool)in_stack_000011e3);
            (*(in_RDI->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])();
            if ((local_1d9 & 1) != 0) {
              SPxOut::
              debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[13],_0>
                        (in_RDI,(char (*) [13])" -> success!");
              local_1b0 = local_1b0 + 1;
              IdxSet::remove(&local_948,(char *)(ulong)local_adc);
              if ((-1 < in_RDI->maxIters) &&
                 (iVar5 = iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)0x6b20c6), in_RDI->maxIters <= iVar5)) {
                local_1a9 = 1;
              }
            }
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[2],_0>
                      (in_RDI,(char (*) [2])0x7e7535);
            bVar3 = isTimeLimitReached(in_stack_fffffffffffff168,(bool)in_stack_fffffffffffff167);
            uVar16 = extraout_RDX_06;
            if (bVar3) {
              local_1a9 = 1;
            }
          }
          if (local_1b0 == 0) {
            local_1a9 = 1;
          }
          in_RDI->polishCount = local_1b0 + in_RDI->polishCount;
        }
        DIdxSet::~DIdxSet((DIdxSet *)
                          CONCAT17(in_stack_fffffffffffff0c7,
                                   CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)));
      }
      else {
        dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x6b2186);
        DIdxSet::DIdxSet(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0dc);
        for (local_b04 = 0; iVar5 = local_b04,
            iVar10 = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0x6b21b8), iVar5 < iVar10; local_b04 = local_b04 + 1) {
          pDVar14 = &SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT17(in_stack_fffffffffffff0c7,
                                          CONCAT16(in_stack_fffffffffffff0c6,
                                                   in_stack_fffffffffffff0c0)),
                              in_stack_fffffffffffff0bc)->super_DataKey;
          local_1d8 = *pDVar14;
          bVar3 = SPxId::isSPxRowId((SPxId *)&local_1d8);
          if (!bVar3) {
            bVar3 = false;
            if ((local_91d & 1) != 0) {
              this_00 = &in_RDI->integerVariables;
              SPxColId::SPxColId(&local_b0c,(SPxId *)&local_1d8);
              iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT17(in_stack_fffffffffffff0c7,
                                           CONCAT16(in_stack_fffffffffffff0c6,
                                                    in_stack_fffffffffffff0c0)),
                               (SPxColId *)
                               CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
              piVar12 = DataArray<int>::operator[](this_00,iVar5);
              bVar3 = *piVar12 == 0;
            }
            if ((!bVar3) &&
               ((local_1cc = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ::Desc::colStatus((Desc *)CONCAT17(in_stack_fffffffffffff0c7,
                                                                CONCAT16(in_stack_fffffffffffff0c6,
                                                                         in_stack_fffffffffffff0c0))
                                               ,in_stack_fffffffffffff0bc), local_1cc == P_ON_LOWER
                || (local_1cc == P_ON_UPPER)))) {
              local_f8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)CONCAT17(in_stack_fffffffffffff0c7,
                                                  CONCAT16(in_stack_fffffffffffff0c6,
                                                           in_stack_fffffffffffff0c0)),
                                      in_stack_fffffffffffff0bc);
              local_f0 = local_b8c;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<200U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff0c7,
                                  CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)),
                         (cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
              local_c10 = 0;
              local_128 = local_c0c;
              local_130 = &local_c10;
              local_138 = 0;
              local_a8 = local_130;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>
                        ((cpp_dec_float<200U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff0d7,
                                  CONCAT16(in_stack_fffffffffffff0d6,
                                           CONCAT24(in_stack_fffffffffffff0d4,
                                                    in_stack_fffffffffffff0d0))),
                         (longlong)in_stack_fffffffffffff0c8,
                         (type *)CONCAT17(in_stack_fffffffffffff0c7,
                                          CONCAT16(in_stack_fffffffffffff0c6,
                                                   in_stack_fffffffffffff0c0)));
              epsilon(in_stack_fffffffffffff0c8);
              in_stack_fffffffffffff0d7 =
                   EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                              in_stack_fffffffffffff2c0);
              if ((bool)in_stack_fffffffffffff0d7) {
                DIdxSet::addIdx((DIdxSet *)
                                CONCAT17(in_stack_fffffffffffff0c7,
                                         CONCAT16(in_stack_fffffffffffff0c6,
                                                  in_stack_fffffffffffff0c0)),
                                in_stack_fffffffffffff0bc);
              }
            }
          }
        }
        while (stat_00 = (SPxStatus)((ulong)in_stack_fffffffffffff0c8 >> 0x20),
              ((local_1a9 ^ 0xff) & 1) != 0) {
          local_1b0 = 0;
          local_c94 = IdxSet::size(&local_b00);
          uVar16 = extraout_RDX_07;
          while( true ) {
            local_c94 = local_c94 - 1;
            in_stack_fffffffffffff0d6 = 0;
            if (-1 < (int)local_c94) {
              in_stack_fffffffffffff0d6 = local_1a9 ^ 0xff;
            }
            if ((in_stack_fffffffffffff0d6 & 1) == 0) break;
            in_stack_fffffffffffff0c8 =
                 (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)&in_RDI->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ;
            IdxSet::index(&local_b00,(char *)(ulong)local_c94,(int)uVar16);
            pSVar15 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT17(in_stack_fffffffffffff0c7,
                                           CONCAT16(in_stack_fffffffffffff0c6,
                                                    in_stack_fffffffffffff0c0)),
                               in_stack_fffffffffffff0bc);
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[17],_soplex::SPxId_&,_0>
                      (in_RDI,(char (*) [17])"try pivoting: {}",pSVar15);
            IdxSet::index(&local_b00,(char *)(ulong)local_c94,__c_03);
            in_stack_fffffffffffff0c7 =
                 leave(in_stack_000011e8,in_stack_000011e4,(bool)in_stack_000011e3);
            local_1d9 = in_stack_fffffffffffff0c7;
            (*(in_RDI->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])();
            if ((local_1d9 & 1) != 0) {
              SPxOut::
              debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[13],_0>
                        (in_RDI,(char (*) [13])" -> success!");
              local_1b0 = local_1b0 + 1;
              IdxSet::remove(&local_b00,(char *)(ulong)local_c94);
              if ((-1 < in_RDI->maxIters) &&
                 (iVar5 = iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)0x6b2570), in_RDI->maxIters <= iVar5)) {
                local_1a9 = 1;
              }
            }
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[2],_0>
                      (in_RDI,(char (*) [2])0x7e7535);
            in_stack_fffffffffffff0c6 =
                 isTimeLimitReached(in_stack_fffffffffffff168,(bool)in_stack_fffffffffffff167);
            uVar16 = extraout_RDX_08;
            if ((bool)in_stack_fffffffffffff0c6) {
              local_1a9 = 1;
            }
          }
          if (local_1b0 == 0) {
            local_1a9 = 1;
          }
          in_RDI->polishCount = local_1b0 + in_RDI->polishCount;
        }
        DIdxSet::~DIdxSet((DIdxSet *)
                          CONCAT17(in_stack_fffffffffffff0c7,
                                   CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)));
      }
    }
    if ((in_RDI->spxout != (SPxOut *)0x0) &&
       (VVar7 = SPxOut::getVerbosity(in_RDI->spxout), 2 < (int)VVar7)) {
      local_c98 = SPxOut::getVerbosity(in_RDI->spxout);
      local_c9c = 3;
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_c9c);
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffff0c7,
                                  CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)),
                         (char *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffff0c7,
                                  CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)),
                         in_stack_fffffffffffff0bc);
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffff0c7,
                                  CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)),
                         (char *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffff0c7,
                                  CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)),
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_c98);
    }
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setStatus((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT17(in_stack_fffffffffffff0d7,
                            CONCAT16(in_stack_fffffffffffff0d6,
                                     CONCAT24(in_stack_fffffffffffff0d4,in_stack_fffffffffffff0d0)))
                ,stat_00);
    (*(in_RDI->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x5e])(local_d1c);
    local_e0 = local_d9c;
    local_e8 = local_2dc;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff0c7,
                        CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)),
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
    local_d0 = local_e1c;
    local_d8 = local_25c;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff0c7,
                        CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)),
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
    bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0
                      );
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      local_199 = false;
    }
    else {
      local_199 = true;
    }
  }
  else {
    local_199 = false;
  }
  return local_199;
}

Assistant:

bool SPxSolverBase<R>::performSolutionPolishing()
{
   // catch rare case that the iteration limit is exactly reached at optimality
   bool stop = (maxIters >= 0 && iterations() >= maxIters && !isTimeLimitReached());

   // only polish an already optimal basis
   if(stop || polishObj == POLISH_OFF || status() != OPTIMAL)
      return false;

   int nSuccessfulPivots;
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   const typename SPxBasisBase<R>::Desc::Status* rowstatus = ds.rowStatus();
   const typename SPxBasisBase<R>::Desc::Status* colstatus = ds.colStatus();
   typename SPxBasisBase<R>::Desc::Status stat;
   SPxId polishId;
   bool success = false;

   R alloweddeviation;
   R origval = value();

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- perform solution polishing" << std::endl;)

   if(rep() == COLUMN)
   {
      setType(ENTER); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = entertol();

      instableEnter = false;
      theratiotester->setType(type());

      int nrows = this->nRows();
      int ncols = this->nCols();

      assert(nrows >= 0);
      assert(ncols >= 0);

      if(polishObj == POLISH_INTEGRALITY)
      {
         DIdxSet slackcandidates(nrows);
         DIdxSet continuousvars(ncols);

         // collect nonbasic slack variables that could be made basic
         for(int i = 0; i < nrows; ++i)
         {
            // only check nonbasic rows, skip equations
            if(rowstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_LOWER
                  || rowstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider rows with zero dual multiplier to preserve optimality
               if(EQrel((*theCoPvec)[i], (R) 0, this->epsilon()))
                  slackcandidates.addIdx(i);
            }
         }

         // collect continuous variables that could be made basic
         if(integerVariables.size() == ncols)
         {
            for(int i = 0; i < ncols; ++i)
            {
               // skip fixed variables
               if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                     || colstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
               {
                  // only consider continuous variables with zero dual multiplier to preserve optimality
                  if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()) && integerVariables[i] == 0)
                     continuousvars.addIdx(i);
               }
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            // identify nonbasic slack variables, i.e. rows, that may be moved into the basis
            for(int i = slackcandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = coId(slackcandidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, rowstatus[slackcandidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  slackcandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // identify nonbasic variables that may be moved into the basis
            for(int i = continuousvars.size() - 1; i >= 0 && !stop; --i)
            {
               polishId = id(continuousvars.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[continuousvars.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  continuousvars.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet candidates(dim());

         // identify nonbasic variables, i.e. columns, that may be moved into the basis
         for(int i = 0; i < this->nCols() && !stop; ++i)
         {
            if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || colstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider variables with zero reduced costs to preserve optimality
               if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()))
                  candidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = candidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = id(candidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[candidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  candidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }
   else
   {
      setType(LEAVE); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = leavetol();
      instableLeave = false;
      theratiotester->setType(type());
      bool useIntegrality = false;
      int ncols = this->nCols();

      if(integerVariables.size() == ncols)
         useIntegrality = true;

      // in ROW rep: pivot slack out of the basis
      if(polishObj == POLISH_INTEGRALITY)
      {
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic candidates that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               stat = ds.rowStatus(this->number(polishId));
            else
            {
               // skip (integer) variables
               if(!useIntegrality || integerVariables[this->number(SPxColId(polishId))] == 1)
                  continue;

               stat = ds.colStatus(this->number(polishId));
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic (integer) variables, that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               continue;
            else
            {
               if(useIntegrality && integerVariables[this->number(SPxColId(polishId))] == 0)
                  continue;

               stat = ds.colStatus(i);
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }

   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- finished solution polishing (" << polishCount << " pivots)" << std::endl;)

   this->setStatus(SPxBasisBase<R>::OPTIMAL);

   // if the value() changed significantly (due to numerics) reoptimize after polishing
   if(!EQrel(value(), origval, alloweddeviation))
      return true;
   else
      return false;
}